

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_gsv_text.cpp
# Opt level: O3

void __thiscall agg::gsv_text::load_font(gsv_text *this,char *file)

{
  FILE *__stream;
  ulong uVar1;
  
  pod_array<char>::resize(&this->m_loaded_font,0);
  __stream = fopen(file,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    uVar1 = ftell(__stream);
    fseek(__stream,0,0);
    if ((uint)uVar1 != 0) {
      pod_array<char>::resize(&this->m_loaded_font,(uint)uVar1);
      fread((this->m_loaded_font).m_array,1,uVar1 & 0xffffffff,__stream);
      this->m_font = (this->m_loaded_font).m_array;
    }
    fclose(__stream);
    return;
  }
  return;
}

Assistant:

void gsv_text::load_font(const char* file)
    {
        m_loaded_font.resize(0);
        FILE* fd = fopen(file, "rb");
        if(fd)
        {
            unsigned len;

            fseek(fd, 0l, SEEK_END);
            len = ftell(fd);
            fseek(fd, 0l, SEEK_SET);
            if(len > 0)
            {
                m_loaded_font.resize(len);
                fread(&m_loaded_font[0], 1, len, fd);
                m_font = &m_loaded_font[0];
            }
            fclose(fd);
        }
    }